

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O3

void jpeg_idct_15x15(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  int iVar2;
  JSAMPLE *pJVar3;
  void *pvVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  int iVar34;
  int iVar35;
  long lVar36;
  int iVar37;
  long lVar38;
  int iVar39;
  long lVar40;
  int iVar41;
  long lVar42;
  int aiStack_218 [122];
  
  pJVar3 = cinfo->sample_range_limit;
  pvVar4 = compptr->dct_table;
  lVar24 = 0;
  do {
    lVar21 = (long)*(int *)((long)pvVar4 + lVar24 * 4) * (long)coef_block[lVar24] * 0x2000;
    lVar26 = (long)*(int *)((long)pvVar4 + lVar24 * 4 + 0x40) * (long)coef_block[lVar24 + 0x10];
    lVar9 = (long)*(int *)((long)pvVar4 + lVar24 * 4 + 0x80) * (long)coef_block[lVar24 + 0x20];
    lVar29 = (long)*(int *)((long)pvVar4 + lVar24 * 4 + 0xc0) * (long)coef_block[lVar24 + 0x30];
    lVar13 = lVar29 * -0xdfc + lVar21 + 0x400;
    lVar17 = lVar29 * 0x249d + lVar21 + 0x400;
    lVar21 = lVar29 * -0x2d42 + lVar21 + 0x400;
    lVar40 = lVar26 - lVar9;
    lVar9 = lVar9 + lVar26;
    lVar30 = lVar40 * 0x176 + lVar9 * 0x2ace + lVar17;
    lVar42 = lVar40 * 0x176 + lVar13 + lVar26 * 0x2e13 + lVar9 * -0x2ace;
    lVar38 = lVar40 * -0xcc7 + lVar9 * -0x1182 + lVar17;
    lVar33 = lVar40 * -0xcc7 + lVar13 + lVar9 * 0x1182 + lVar26 * -0x2e13;
    lVar13 = lVar40 * 0xb50 + lVar9 * 0x194c + lVar13;
    lVar18 = lVar17 + lVar9 * -0x194c + lVar40 * 0xb50;
    lVar36 = lVar40 * 0x16a0 + lVar21;
    lVar29 = (long)*(int *)((long)pvVar4 + lVar24 * 4 + 0x20) * (long)coef_block[lVar24 + 8];
    lVar10 = (long)*(int *)((long)pvVar4 + lVar24 * 4 + 0x60) * (long)coef_block[lVar24 + 0x18];
    lVar31 = (long)*(int *)((long)pvVar4 + lVar24 * 4 + 0xa0) * (long)coef_block[lVar24 + 0x28];
    lVar14 = (long)*(int *)((long)pvVar4 + lVar24 * 4 + 0xe0) * (long)coef_block[lVar24 + 0x38];
    lVar17 = ((lVar10 - lVar14) + lVar29) * 0x1a9a;
    lVar9 = lVar29 * 0x1071 + lVar17;
    lVar17 = (lVar10 - lVar14) * -0x45a4 + lVar17;
    lVar26 = (lVar29 - lVar14) * 0x2d02 + lVar31 * 0x2731;
    lVar11 = lVar14 * 0x4ea3 + lVar10 * 0x2b0a + lVar26;
    lVar26 = lVar29 * -0x2399 + lVar10 * -0x1a9a + lVar26;
    lVar27 = (lVar29 - lVar14) - lVar31;
    lVar15 = (lVar29 + lVar14) * 0x1268;
    lVar29 = lVar29 * 0xf39 + lVar10 * -0x1a9a + lVar31 * -0x2731 + lVar15;
    lVar15 = lVar31 * 0x2731 + lVar10 * -0x2b0a + lVar14 * -0x1bd1 + lVar15;
    aiStack_218[lVar24] = (int)((ulong)(lVar11 + lVar30) >> 0xb);
    aiStack_218[lVar24 + 0x70] = (int)((ulong)(lVar30 - lVar11) >> 0xb);
    aiStack_218[lVar24 + 8] = (int)((ulong)(lVar9 + lVar13) >> 0xb);
    aiStack_218[lVar24 + 0x68] = (int)((ulong)(lVar13 - lVar9) >> 0xb);
    aiStack_218[lVar24 + 0x10] = (int)((ulong)(lVar27 * 0x2731 + lVar36) >> 0xb);
    aiStack_218[lVar24 + 0x60] = (int)((ulong)(lVar36 + lVar27 * -0x2731) >> 0xb);
    aiStack_218[lVar24 + 0x18] = (int)((ulong)(lVar29 + lVar42) >> 0xb);
    aiStack_218[lVar24 + 0x58] = (int)((ulong)(lVar42 - lVar29) >> 0xb);
    aiStack_218[lVar24 + 0x20] = (int)((ulong)(lVar17 + lVar18) >> 0xb);
    aiStack_218[lVar24 + 0x50] = (int)((ulong)(lVar18 - lVar17) >> 0xb);
    aiStack_218[lVar24 + 0x28] = (int)((ulong)(lVar38 + lVar15) >> 0xb);
    aiStack_218[lVar24 + 0x48] = (int)((ulong)(lVar38 - lVar15) >> 0xb);
    aiStack_218[lVar24 + 0x30] = (int)((ulong)(lVar33 + lVar26) >> 0xb);
    aiStack_218[lVar24 + 0x40] = (int)((ulong)(lVar33 - lVar26) >> 0xb);
    aiStack_218[lVar24 + 0x38] = (int)((ulong)(lVar40 * 0x7ffffffd2c0 + lVar21) >> 0xb);
    lVar24 = lVar24 + 1;
  } while ((int)lVar24 != 8);
  uVar6 = (ulong)output_col;
  lVar24 = 0;
  do {
    iVar16 = aiStack_218[lVar24 + 1];
    iVar7 = aiStack_218[lVar24] * 0x2000;
    iVar1 = aiStack_218[lVar24 + 2];
    iVar2 = aiStack_218[lVar24 + 6];
    iVar12 = iVar2 * -0xdfc + iVar7 + 0x20000;
    iVar34 = iVar2 * 0x249d + iVar7 + 0x20000;
    iVar5 = iVar1 - aiStack_218[lVar24 + 4];
    iVar22 = aiStack_218[lVar24 + 4] + iVar1;
    iVar8 = iVar7 + iVar2 * -0x2d42 + 0x20000;
    iVar19 = iVar5 * 0x176 + iVar22 * 0x2ace + iVar34;
    iVar20 = iVar5 * -0xcc7 + iVar22 * -0x1182 + iVar34;
    iVar28 = iVar5 * 0xb50 + iVar22 * 0x194c + iVar12;
    iVar25 = iVar5 * -0xcc7 + iVar12 + iVar22 * 0x1182 + iVar1 * -0x2e13;
    iVar37 = iVar5 * 0x16a0 + iVar8;
    iVar2 = aiStack_218[lVar24 + 3];
    iVar7 = aiStack_218[lVar24 + 7];
    iVar32 = iVar5 * 0x176 + iVar12 + iVar1 * 0x2e13 + iVar22 * -0x2ace;
    iVar35 = iVar34 + iVar22 * -0x194c + iVar5 * 0xb50;
    iVar12 = ((iVar2 - iVar7) + iVar16) * 0x1a9a;
    iVar41 = iVar16 * 0x1071 + iVar12;
    iVar12 = (iVar2 - iVar7) * -0x45a4 + iVar12;
    iVar1 = aiStack_218[lVar24 + 5];
    iVar23 = (iVar16 - iVar7) - iVar1;
    iVar22 = (iVar16 - iVar7) * 0x2d02 + iVar1 * 0x2731;
    iVar39 = iVar7 * 0x4ea3 + iVar2 * 0x2b0a + iVar22;
    iVar22 = iVar16 * -0x2399 + iVar2 * -0x1a9a + iVar22;
    iVar34 = (iVar7 + iVar16) * 0x1268;
    iVar16 = iVar16 * 0xf39 + iVar2 * -0x1a9a + iVar1 * -0x2731 + iVar34;
    iVar34 = iVar1 * 0x2731 + iVar2 * -0x2b0a + iVar7 * -0x1bd1 + iVar34;
    lVar21 = *(long *)((long)output_buf + lVar24);
    *(JSAMPLE *)(lVar21 + uVar6) = pJVar3[(ulong)((uint)(iVar39 + iVar19) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar21 + 0xe + uVar6) =
         pJVar3[(ulong)((uint)(iVar19 - iVar39) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar21 + 1 + uVar6) =
         pJVar3[(ulong)((uint)(iVar41 + iVar28) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar21 + 0xd + uVar6) =
         pJVar3[(ulong)((uint)(iVar28 - iVar41) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar21 + 2 + uVar6) =
         pJVar3[(ulong)((uint)(iVar23 * 0x2731 + iVar37) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar21 + 0xc + uVar6) =
         pJVar3[(ulong)((uint)(iVar37 + iVar23 * -0x2731) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar21 + 3 + uVar6) =
         pJVar3[(ulong)((uint)(iVar16 + iVar32) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar21 + 0xb + uVar6) =
         pJVar3[(ulong)((uint)(iVar32 - iVar16) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar21 + 4 + uVar6) =
         pJVar3[(ulong)((uint)(iVar12 + iVar35) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar21 + 10 + uVar6) =
         pJVar3[(ulong)((uint)(iVar35 - iVar12) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar21 + 5 + uVar6) =
         pJVar3[(ulong)((uint)(iVar34 + iVar20) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar21 + 9 + uVar6) =
         pJVar3[(ulong)((uint)(iVar20 - iVar34) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar21 + 6 + uVar6) =
         pJVar3[(ulong)((uint)(iVar22 + iVar25) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar21 + 8 + uVar6) =
         pJVar3[(ulong)((uint)(iVar25 - iVar22) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar21 + 7 + uVar6) =
         pJVar3[(ulong)((uint)(iVar5 * 0xfffd2c0 + iVar8) >> 0x12 & 0x3ff) + 0x80];
    lVar24 = lVar24 + 8;
  } while (lVar24 != 0x78);
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_15x15 (j_decompress_ptr cinfo, jpeg_component_info * compptr,
		 JCOEFPTR coef_block,
		 JSAMPARRAY output_buf, JDIMENSION output_col)
{
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14, tmp15, tmp16;
  INT32 tmp20, tmp21, tmp22, tmp23, tmp24, tmp25, tmp26, tmp27;
  INT32 z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE * quantptr;
  int * wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8*15];	/* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *) compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    z1 = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]);
    z1 <<= CONST_BITS;
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS-PASS1_BITS-1);

    z2 = DEQUANTIZE(inptr[DCTSIZE*2], quantptr[DCTSIZE*2]);
    z3 = DEQUANTIZE(inptr[DCTSIZE*4], quantptr[DCTSIZE*4]);
    z4 = DEQUANTIZE(inptr[DCTSIZE*6], quantptr[DCTSIZE*6]);

    tmp10 = MULTIPLY(z4, FIX(0.437016024)); /* c12 */
    tmp11 = MULTIPLY(z4, FIX(1.144122806)); /* c6 */

    tmp12 = z1 - tmp10;
    tmp13 = z1 + tmp11;
    z1 -= (tmp11 - tmp10) << 1;             /* c0 = (c6-c12)*2 */

    z4 = z2 - z3;
    z3 += z2;
    tmp10 = MULTIPLY(z3, FIX(1.337628990)); /* (c2+c4)/2 */
    tmp11 = MULTIPLY(z4, FIX(0.045680613)); /* (c2-c4)/2 */
    z2 = MULTIPLY(z2, FIX(1.439773946));    /* c4+c14 */

    tmp20 = tmp13 + tmp10 + tmp11;
    tmp23 = tmp12 - tmp10 + tmp11 + z2;

    tmp10 = MULTIPLY(z3, FIX(0.547059574)); /* (c8+c14)/2 */
    tmp11 = MULTIPLY(z4, FIX(0.399234004)); /* (c8-c14)/2 */

    tmp25 = tmp13 - tmp10 - tmp11;
    tmp26 = tmp12 + tmp10 - tmp11 - z2;

    tmp10 = MULTIPLY(z3, FIX(0.790569415)); /* (c6+c12)/2 */
    tmp11 = MULTIPLY(z4, FIX(0.353553391)); /* (c6-c12)/2 */

    tmp21 = tmp12 + tmp10 + tmp11;
    tmp24 = tmp13 - tmp10 + tmp11;
    tmp11 += tmp11;
    tmp22 = z1 + tmp11;                     /* c10 = c6-c12 */
    tmp27 = z1 - tmp11 - tmp11;             /* c0 = (c6-c12)*2 */

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE*1], quantptr[DCTSIZE*1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE*3], quantptr[DCTSIZE*3]);
    z4 = DEQUANTIZE(inptr[DCTSIZE*5], quantptr[DCTSIZE*5]);
    z3 = MULTIPLY(z4, FIX(1.224744871));                    /* c5 */
    z4 = DEQUANTIZE(inptr[DCTSIZE*7], quantptr[DCTSIZE*7]);

    tmp13 = z2 - z4;
    tmp15 = MULTIPLY(z1 + tmp13, FIX(0.831253876));         /* c9 */
    tmp11 = tmp15 + MULTIPLY(z1, FIX(0.513743148));         /* c3-c9 */
    tmp14 = tmp15 - MULTIPLY(tmp13, FIX(2.176250899));      /* c3+c9 */

    tmp13 = MULTIPLY(z2, - FIX(0.831253876));               /* -c9 */
    tmp15 = MULTIPLY(z2, - FIX(1.344997024));               /* -c3 */
    z2 = z1 - z4;
    tmp12 = z3 + MULTIPLY(z2, FIX(1.406466353));            /* c1 */

    tmp10 = tmp12 + MULTIPLY(z4, FIX(2.457431844)) - tmp15; /* c1+c7 */
    tmp16 = tmp12 - MULTIPLY(z1, FIX(1.112434820)) + tmp13; /* c1-c13 */
    tmp12 = MULTIPLY(z2, FIX(1.224744871)) - z3;            /* c5 */
    z2 = MULTIPLY(z1 + z4, FIX(0.575212477));               /* c11 */
    tmp13 += z2 + MULTIPLY(z1, FIX(0.475753014)) - z3;      /* c7-c11 */
    tmp15 += z2 - MULTIPLY(z4, FIX(0.869244010)) + z3;      /* c11+c13 */

    /* Final output stage */

    wsptr[8*0]  = (int) RIGHT_SHIFT(tmp20 + tmp10, CONST_BITS-PASS1_BITS);
    wsptr[8*14] = (int) RIGHT_SHIFT(tmp20 - tmp10, CONST_BITS-PASS1_BITS);
    wsptr[8*1]  = (int) RIGHT_SHIFT(tmp21 + tmp11, CONST_BITS-PASS1_BITS);
    wsptr[8*13] = (int) RIGHT_SHIFT(tmp21 - tmp11, CONST_BITS-PASS1_BITS);
    wsptr[8*2]  = (int) RIGHT_SHIFT(tmp22 + tmp12, CONST_BITS-PASS1_BITS);
    wsptr[8*12] = (int) RIGHT_SHIFT(tmp22 - tmp12, CONST_BITS-PASS1_BITS);
    wsptr[8*3]  = (int) RIGHT_SHIFT(tmp23 + tmp13, CONST_BITS-PASS1_BITS);
    wsptr[8*11] = (int) RIGHT_SHIFT(tmp23 - tmp13, CONST_BITS-PASS1_BITS);
    wsptr[8*4]  = (int) RIGHT_SHIFT(tmp24 + tmp14, CONST_BITS-PASS1_BITS);
    wsptr[8*10] = (int) RIGHT_SHIFT(tmp24 - tmp14, CONST_BITS-PASS1_BITS);
    wsptr[8*5]  = (int) RIGHT_SHIFT(tmp25 + tmp15, CONST_BITS-PASS1_BITS);
    wsptr[8*9]  = (int) RIGHT_SHIFT(tmp25 - tmp15, CONST_BITS-PASS1_BITS);
    wsptr[8*6]  = (int) RIGHT_SHIFT(tmp26 + tmp16, CONST_BITS-PASS1_BITS);
    wsptr[8*8]  = (int) RIGHT_SHIFT(tmp26 - tmp16, CONST_BITS-PASS1_BITS);
    wsptr[8*7]  = (int) RIGHT_SHIFT(tmp27, CONST_BITS-PASS1_BITS);
  }

  /* Pass 2: process 15 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 15; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    z1 = (INT32) wsptr[0] + (ONE << (PASS1_BITS+2));
    z1 <<= CONST_BITS;

    z2 = (INT32) wsptr[2];
    z3 = (INT32) wsptr[4];
    z4 = (INT32) wsptr[6];

    tmp10 = MULTIPLY(z4, FIX(0.437016024)); /* c12 */
    tmp11 = MULTIPLY(z4, FIX(1.144122806)); /* c6 */

    tmp12 = z1 - tmp10;
    tmp13 = z1 + tmp11;
    z1 -= (tmp11 - tmp10) << 1;             /* c0 = (c6-c12)*2 */

    z4 = z2 - z3;
    z3 += z2;
    tmp10 = MULTIPLY(z3, FIX(1.337628990)); /* (c2+c4)/2 */
    tmp11 = MULTIPLY(z4, FIX(0.045680613)); /* (c2-c4)/2 */
    z2 = MULTIPLY(z2, FIX(1.439773946));    /* c4+c14 */

    tmp20 = tmp13 + tmp10 + tmp11;
    tmp23 = tmp12 - tmp10 + tmp11 + z2;

    tmp10 = MULTIPLY(z3, FIX(0.547059574)); /* (c8+c14)/2 */
    tmp11 = MULTIPLY(z4, FIX(0.399234004)); /* (c8-c14)/2 */

    tmp25 = tmp13 - tmp10 - tmp11;
    tmp26 = tmp12 + tmp10 - tmp11 - z2;

    tmp10 = MULTIPLY(z3, FIX(0.790569415)); /* (c6+c12)/2 */
    tmp11 = MULTIPLY(z4, FIX(0.353553391)); /* (c6-c12)/2 */

    tmp21 = tmp12 + tmp10 + tmp11;
    tmp24 = tmp13 - tmp10 + tmp11;
    tmp11 += tmp11;
    tmp22 = z1 + tmp11;                     /* c10 = c6-c12 */
    tmp27 = z1 - tmp11 - tmp11;             /* c0 = (c6-c12)*2 */

    /* Odd part */

    z1 = (INT32) wsptr[1];
    z2 = (INT32) wsptr[3];
    z4 = (INT32) wsptr[5];
    z3 = MULTIPLY(z4, FIX(1.224744871));                    /* c5 */
    z4 = (INT32) wsptr[7];

    tmp13 = z2 - z4;
    tmp15 = MULTIPLY(z1 + tmp13, FIX(0.831253876));         /* c9 */
    tmp11 = tmp15 + MULTIPLY(z1, FIX(0.513743148));         /* c3-c9 */
    tmp14 = tmp15 - MULTIPLY(tmp13, FIX(2.176250899));      /* c3+c9 */

    tmp13 = MULTIPLY(z2, - FIX(0.831253876));               /* -c9 */
    tmp15 = MULTIPLY(z2, - FIX(1.344997024));               /* -c3 */
    z2 = z1 - z4;
    tmp12 = z3 + MULTIPLY(z2, FIX(1.406466353));            /* c1 */

    tmp10 = tmp12 + MULTIPLY(z4, FIX(2.457431844)) - tmp15; /* c1+c7 */
    tmp16 = tmp12 - MULTIPLY(z1, FIX(1.112434820)) + tmp13; /* c1-c13 */
    tmp12 = MULTIPLY(z2, FIX(1.224744871)) - z3;            /* c5 */
    z2 = MULTIPLY(z1 + z4, FIX(0.575212477));               /* c11 */
    tmp13 += z2 + MULTIPLY(z1, FIX(0.475753014)) - z3;      /* c7-c11 */
    tmp15 += z2 - MULTIPLY(z4, FIX(0.869244010)) + z3;      /* c11+c13 */

    /* Final output stage */

    outptr[0]  = range_limit[(int) RIGHT_SHIFT(tmp20 + tmp10,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[14] = range_limit[(int) RIGHT_SHIFT(tmp20 - tmp10,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[1]  = range_limit[(int) RIGHT_SHIFT(tmp21 + tmp11,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[13] = range_limit[(int) RIGHT_SHIFT(tmp21 - tmp11,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[2]  = range_limit[(int) RIGHT_SHIFT(tmp22 + tmp12,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[12] = range_limit[(int) RIGHT_SHIFT(tmp22 - tmp12,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[3]  = range_limit[(int) RIGHT_SHIFT(tmp23 + tmp13,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[11] = range_limit[(int) RIGHT_SHIFT(tmp23 - tmp13,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[4]  = range_limit[(int) RIGHT_SHIFT(tmp24 + tmp14,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[10] = range_limit[(int) RIGHT_SHIFT(tmp24 - tmp14,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[5]  = range_limit[(int) RIGHT_SHIFT(tmp25 + tmp15,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[9]  = range_limit[(int) RIGHT_SHIFT(tmp25 - tmp15,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[6]  = range_limit[(int) RIGHT_SHIFT(tmp26 + tmp16,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[8]  = range_limit[(int) RIGHT_SHIFT(tmp26 - tmp16,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[7]  = range_limit[(int) RIGHT_SHIFT(tmp27,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];

    wsptr += 8;		/* advance pointer to next row */
  }
}